

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O3

HandlePtr __thiscall
dg::vr::ValueRelations::getCorresponding
          (ValueRelations *this,ValueRelations *other,Handle otherH,
          VectorSet<const_llvm::Value_*> *otherEqual)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  pointer ppVVar3;
  Value *pVVar4;
  V val;
  pointer prVar5;
  Handle pBVar6;
  pointer ppVar7;
  _Base_ptr *pp_Var8;
  bool bVar9;
  const_iterator __begin3;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  Bucket *pBVar12;
  const_iterator cVar13;
  HandlePtr from;
  pointer ppVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  const_iterator __begin2;
  pointer ppVVar17;
  unsigned_long uVar18;
  pointer ppVar19;
  HandlePtr mRt;
  HandlePtr mLt;
  Bucket *lt;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar20;
  Handle local_58;
  key_type local_38;
  
  ppVVar17 = (otherEqual->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppVVar3 = (otherEqual->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar17 == ppVVar3) {
    prVar5 = (otherH->relatedBuckets)._M_elems[0xb].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar5 == (otherH->relatedBuckets)._M_elems[0xb].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar14 = (other->graph).borderBuckets.
                super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar7 = (other->graph).borderBuckets.
               super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar18 = 0xffffffffffffffff;
      if (ppVar14 != ppVar7) {
        ppVar19 = ppVar14;
        do {
          if (((ppVar19->second)._M_data)->id == otherH->id) {
            uVar18 = ppVar19->first;
            break;
          }
          ppVar19 = ppVar19 + 1;
        } while (ppVar19 != ppVar7);
      }
      for (ppVar19 = (this->graph).borderBuckets.
                     super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar19 !=
          (this->graph).borderBuckets.
          super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar19 = ppVar19 + 1) {
        if (ppVar19->first == uVar18) {
          pBVar6 = (ppVar19->second)._M_data;
          if (pBVar6 != (Handle)0x0) {
            return pBVar6;
          }
          break;
        }
      }
      uVar18 = 0xffffffffffffffff;
      if (ppVar14 != ppVar7) {
        do {
          if (((ppVar14->second)._M_data)->id == otherH->id) {
            uVar18 = ppVar14->first;
            break;
          }
          ppVar14 = ppVar14 + 1;
        } while (ppVar14 != ppVar7);
      }
      local_58 = RelationsGraph<dg::vr::ValueRelations>::getBorderBucket(&this->graph,uVar18);
      local_38._M_data = local_58;
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
      ::operator[](&this->bucketToVals,&local_38);
    }
    else {
      pBVar6 = prVar5->_M_data;
      local_38._M_data = pBVar6;
      cVar13 = std::
               _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
               ::find(&(other->bucketToVals)._M_t,&local_38);
      from = getCorresponding(this,other,pBVar6,
                              (VectorSet<const_llvm::Value_*> *)&cVar13._M_node[1]._M_parent);
      if (from == (HandlePtr)0x0) {
        local_58 = (Handle)0x0;
      }
      else {
        local_58 = newPlaceholderBucket<dg::vr::Bucket>(this,from);
        bVar9 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                          (&this->graph,from,PT,local_58,(Relations *)0x0);
        this->changed = (bool)(this->changed | bVar9);
      }
    }
  }
  else {
    p_Var1 = &(this->valToBucket)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = (this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pBVar12 = (Bucket *)0x0;
    do {
      pVVar4 = *ppVVar17;
      p_Var15 = p_Var11;
      p_Var10 = &p_Var1->_M_header;
      if (p_Var11 == (_Base_ptr)0x0) {
LAB_0012c294:
        lt = (Bucket *)0x0;
      }
      else {
        do {
          psVar2 = (size_t *)(p_Var15 + 1);
          if ((Value *)*psVar2 >= pVVar4) {
            p_Var10 = p_Var15;
          }
          pp_Var8 = &p_Var15->_M_left;
          p_Var15 = pp_Var8[(Value *)*psVar2 < pVVar4];
        } while (pp_Var8[(Value *)*psVar2 < pVVar4] != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
           (pVVar4 < (Value *)((_Rb_tree_header *)p_Var10)->_M_node_count)) goto LAB_0012c294;
        lt = *(Bucket **)((long)p_Var10 + 0x28);
      }
      local_58 = lt;
      if (((pBVar12 != (Bucket *)0x0) && (local_58 = pBVar12, lt != (Bucket *)0x0)) &&
         (lt != pBVar12)) {
        bVar9 = RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
                          (&this->graph,lt,EQ,pBVar12,(Relations *)0x0);
        if (bVar9) {
          return (Handle)0x0;
        }
        bVar9 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                          (&this->graph,lt,EQ,pBVar12,(Relations *)0x0);
        this->changed = (bool)(this->changed | bVar9);
        p_Var15 = (this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = (_Base_ptr)0x0;
        p_Var10 = &p_Var1->_M_header;
        p_Var16 = p_Var15;
        local_58 = (Handle)0x0;
        if (p_Var15 != (_Base_ptr)0x0) {
          do {
            p_Var11 = p_Var16 + 1;
            if (*(Value **)p_Var11 >= pVVar4) {
              p_Var10 = p_Var16;
            }
            pp_Var8 = &p_Var16->_M_left;
            p_Var16 = pp_Var8[*(Value **)p_Var11 < pVVar4];
          } while (pp_Var8[*(Value **)p_Var11 < pVVar4] != (_Base_ptr)0x0);
          p_Var11 = p_Var15;
          if (((_Rb_tree_header *)p_Var10 == p_Var1) || (pVVar4 < *(Value **)(p_Var10 + 1))) {
            local_58 = (Handle)0x0;
          }
          else {
            local_58 = (Handle)p_Var10[1]._M_parent;
          }
        }
      }
      ppVVar17 = ppVVar17 + 1;
      pBVar12 = local_58;
    } while (ppVVar17 != ppVVar3);
    if (local_58 == (Handle)0x0) {
      val = *(otherEqual->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      pBVar12 = RelationsGraph<dg::vr::ValueRelations>::getNewBucket(&this->graph);
      pVar20 = add(this,val,pBVar12);
      local_58 = (Handle)pVar20.first._M_data;
    }
  }
  return local_58;
}

Assistant:

ValueRelations::HandlePtr
ValueRelations::getCorresponding(const ValueRelations &other, Handle otherH,
                                 const VectorSet<V> &otherEqual) {
    if (otherEqual.empty()) { // other is a placeholder bucket, therefore it is
                              // pointed to from other bucket
        if (!otherH.hasRelation(Relations::PF)) {
            HandlePtr thisH = getBorderH(other.getBorderId(otherH));
            return thisH ? thisH : &newBorderBucket(other.getBorderId(otherH));
        }
        assert(otherH.hasRelation(Relations::PF));
        Handle otherFromH = otherH.getRelated(Relations::PF);
        HandlePtr thisFromH = getCorresponding(other, otherFromH);
        if (!thisFromH)
            return nullptr;

        Handle h = newPlaceholderBucket(*thisFromH);
        bool ch = graph.addRelation(*thisFromH, Relations::PT, h);
        updateChanged(ch);
        return &h;
    }

    // otherwise find unique handle for all equal elements from other
    HandlePtr mH = nullptr;
    for (V val : otherEqual) {
        HandlePtr oH = maybeGet(val);
        if (!mH) // first handle found
            mH = oH;
        else if (oH && oH != mH) { // found non-equal handle in this
            if (hasConflictingRelation(*oH, *mH, Relations::EQ))
                return nullptr;
            set(*oH, Relations::EQ, *mH);
            mH = maybeGet(val); // update possibly invalidated handle
            assert(mH);
        }
    }
    return mH ? mH : &add(otherEqual.any(), graph.getNewBucket()).first.get();
}